

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O0

void __thiscall MeCab::Dictionary::Dictionary(Dictionary *this)

{
  char **this_00;
  Mmap<char> *p;
  Mmap<char> *in_RDI;
  whatlog *this_01;
  
  in_RDI->_vptr_Mmap = (_func_int **)&PTR__Dictionary_00189bd8;
  this_00 = &in_RDI->text;
  p = (Mmap<char> *)operator_new(0x1d8);
  Mmap<char>::Mmap(in_RDI);
  scoped_ptr<MeCab::Mmap<char>_>::scoped_ptr((scoped_ptr<MeCab::Mmap<char>_> *)this_00,p);
  *(undefined8 *)&in_RDI->fileName = 0;
  *(undefined8 *)&in_RDI->field_0x20 = 0;
  *(undefined8 *)&in_RDI->field_0x28 = 0;
  this_01 = (whatlog *)&(in_RDI->what_).field_0x10;
  std::__cxx11::string::string((string *)this_01);
  whatlog::whatlog(this_01);
  Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
  DoubleArrayImpl((DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
                   *)&in_RDI[1].field_0x28);
  return;
}

Assistant:

explicit Dictionary(): dmmap_(new Mmap<char>), token_(0),
                         feature_(0), charset_(0) {}